

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

size_t __thiscall
compiler::CompilerAstWalker::indexOfConstant<long>
          (CompilerAstWalker *this,long t,vector<long,_std::allocator<long>_> *vec,
          unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
          *lookup)

{
  iterator this_00;
  bool bVar1;
  pointer ppVar2;
  pair<long,_unsigned_long> local_58;
  CompilerAstWalker *local_48;
  size_t vecLen;
  _Node_iterator_base<std::pair<const_long,_unsigned_long>,_false> local_38;
  iterator find;
  unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  *lookup_local;
  vector<long,_std::allocator<long>_> *vec_local;
  long t_local;
  CompilerAstWalker *this_local;
  
  find.super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>)lookup;
  vec_local = (vector<long,_std::allocator<long>_> *)t;
  t_local = (long)this;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
       ::find(lookup,(key_type *)&vec_local);
  vecLen = (size_t)std::
                   unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
                   ::end((unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
                          *)find.
                            super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>.
                            _M_cur);
  bVar1 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_long,_unsigned_long>,_false> *)&vecLen);
  if (bVar1) {
    local_48 = (CompilerAstWalker *)std::vector<long,_std::allocator<long>_>::size(vec);
    std::vector<long,_std::allocator<long>_>::push_back(vec,(value_type_conflict1 *)&vec_local);
    this_00 = find;
    local_58 = std::make_pair<long&,unsigned_long&>((long *)&vec_local,(unsigned_long *)&local_48);
    std::
    unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>
    ::insert<std::pair<long,unsigned_long>>
              ((unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>
                *)this_00.super__Node_iterator_base<std::pair<const_long,_unsigned_long>,_false>.
                  _M_cur,&local_58);
    this_local = local_48;
  }
  else {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_long,_unsigned_long>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_long,_unsigned_long>,_false,_false> *)
                        &local_38);
    this_local = (CompilerAstWalker *)ppVar2->second;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t indexOfConstant(T t, std::vector<T> & vec, std::unordered_map<T, std::size_t> & lookup) noexcept {
    auto find = lookup.find(t);

    if (find == lookup.end()) {
      std::size_t vecLen = vec.size();
      vec.push_back(t);
      lookup.insert(std::make_pair(t, vecLen));
      return vecLen;

    } else {
      return find->second;
    }
  }